

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void init_functions(void)

{
  DFsScript *this;
  int iVar1;
  PClassActor *pPVar2;
  DFsVariable *pDVar3;
  FLineSpecial *pFVar4;
  PClassActor **ppPVar5;
  int special;
  long lVar6;
  
  ppPVar5 = ActorTypes;
  lVar6 = 0;
  do {
    pPVar2 = PClass::FindActor((char *)((long)&_ZL15ActorNames_init_rel +
                                       (long)*(int *)((long)&_ZL15ActorNames_init_rel + lVar6)));
    *ppPVar5 = pPVar2;
    this = global_script;
    lVar6 = lVar6 + 4;
    ppPVar5 = ppPVar5 + 1;
  } while (lVar6 != 0x22c);
  pDVar3 = DFsScript::NewVariable(global_script,"consoleplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"displayplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"zoom",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"fov",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"trigger",8);
  (pDVar3->value).pI = (int *)&trigger_obj;
  iVar1 = P_GetMaxLineSpecial();
  if (-1 < iVar1) {
    special = 0;
    do {
      pFVar4 = P_GetLineSpecialInfo(special);
      if ((pFVar4 != (FLineSpecial *)0x0) && (-1 < pFVar4->max_args)) {
        pDVar3 = DFsScript::NewVariable(this,pFVar4->name,9);
        (pDVar3->value).ls = pFVar4;
      }
      special = special + 1;
    } while (iVar1 + 1 != special);
  }
  DFsScript::NewFunction(this,"break",0x6a6bb0);
  DFsScript::NewFunction(this,"continue",0x6a6b7e);
  DFsScript::NewFunction(this,"return",0x6a6c36);
  DFsScript::NewFunction(this,"goto",0x6a6be6);
  DFsScript::NewFunction(this,"include",0x6a6c58);
  DFsScript::NewFunction(this,"print",0x6a6a88);
  DFsScript::NewFunction(this,"rnd",0x6a6ada);
  DFsScript::NewFunction(this,"prnd",0x6a6ada);
  DFsScript::NewFunction(this,"input",0x6a6ce4);
  DFsScript::NewFunction(this,"beep",0x6a6cf8);
  DFsScript::NewFunction(this,"clock",0x6a6d26);
  DFsScript::NewFunction(this,"wait",0x6ad094);
  DFsScript::NewFunction(this,"tagwait",0x6ad10c);
  DFsScript::NewFunction(this,"scriptwait",0x6ad16a);
  DFsScript::NewFunction(this,"startscript",0x6ad226);
  DFsScript::NewFunction(this,"scriptrunning",0x6ad37c);
  DFsScript::NewFunction(this,"startskill",0x6a989e);
  DFsScript::NewFunction(this,"exitlevel",0x6a6d5a);
  DFsScript::NewFunction(this,"tip",0x6a6d64);
  DFsScript::NewFunction(this,"timedtip",0x6a6e02);
  DFsScript::NewFunction(this,"message",0x6a701a);
  DFsScript::NewFunction(this,"gameskill",0x6aa17a);
  DFsScript::NewFunction(this,"gamemode",0x6aa19c);
  DFsScript::NewFunction(this,"playermsg",0x6a70ac);
  DFsScript::NewFunction(this,"playertip",0x6a6ef0);
  DFsScript::NewFunction(this,"playeringame",0x6a715c);
  DFsScript::NewFunction(this,"playername",0x6a71b0);
  DFsScript::NewFunction(this,"playeraddfrag",0x6abc0e);
  DFsScript::NewFunction(this,"playerobj",0x6a7280);
  DFsScript::NewFunction(this,"isplayerobj",0x6aa1e0);
  DFsScript::NewFunction(this,"isobjplayer",0x6aa1e0);
  DFsScript::NewFunction(this,"skincolor",0x6abcc8);
  DFsScript::NewFunction(this,"playerkeys",0x6aa25c);
  DFsScript::NewFunction(this,"playerammo",0x6aa4fc);
  DFsScript::NewFunction(this,"maxplayerammo",0x6aa6a0);
  DFsScript::NewFunction(this,"playerweapon",0x6aa8de);
  DFsScript::NewFunction(this,"playerselwep",0x6aaa80);
  DFsScript::NewFunction(this,"spawn",0x6a73a6);
  DFsScript::NewFunction(this,"spawnexplosion",0x6ab318);
  DFsScript::NewFunction(this,"radiusattack",0x6ab4c4);
  DFsScript::NewFunction(this,"kill",0x6a761a);
  DFsScript::NewFunction(this,"removeobj",0x6a75d2);
  DFsScript::NewFunction(this,"objx",0x6a76a4);
  DFsScript::NewFunction(this,"objy",0x6a7712);
  DFsScript::NewFunction(this,"objz",0x6a7780);
  DFsScript::NewFunction(this,"testlocation",0x6ab644);
  DFsScript::NewFunction(this,"teleport",0x6a785e);
  DFsScript::NewFunction(this,"silentteleport",0x6a7908);
  DFsScript::NewFunction(this,"damageobj",0x6a79b2);
  DFsScript::NewFunction(this,"healobj",0x6ab6a8);
  DFsScript::NewFunction(this,"player",0x6a7318);
  DFsScript::NewFunction(this,"objsector",0x6a7a94);
  DFsScript::NewFunction(this,"objflag",0x6a7b8a);
  DFsScript::NewFunction(this,"pushobj",0x6a7cc4);
  DFsScript::NewFunction(this,"pushthing",0x6a7cc4);
  DFsScript::NewFunction(this,"objangle",0x6a77ee);
  DFsScript::NewFunction(this,"objhealth",0x6a7b16);
  DFsScript::NewFunction(this,"objdead",0x6ab772);
  DFsScript::NewFunction(this,"reactiontime",0x6a7d4c);
  DFsScript::NewFunction(this,"objreactiontime",0x6a7d4c);
  DFsScript::NewFunction(this,"objtarget",0x6a7dfa);
  DFsScript::NewFunction(this,"objmomx",0x6a7ecc);
  DFsScript::NewFunction(this,"objmomy",0x6a7f6e);
  DFsScript::NewFunction(this,"objmomz",0x6a8010);
  DFsScript::NewFunction(this,"spawnmissile",0x6ab7f8);
  DFsScript::NewFunction(this,"mapthings",0x6aba1e);
  DFsScript::NewFunction(this,"objtype",0x6abe62);
  DFsScript::NewFunction(this,"mapthingnumexist",0x6ab8bc);
  DFsScript::NewFunction(this,"objstate",0x6aba3c);
  DFsScript::NewFunction(this,"resurrect",0x6abcce);
  DFsScript::NewFunction(this,"lineattack",0x6abd68);
  DFsScript::NewFunction(this,"setobjposition",0x6ab566);
  DFsScript::NewFunction(this,"floorheight",0x6a870e);
  DFsScript::NewFunction(this,"floortext",0x6a9428);
  DFsScript::NewFunction(this,"floortexture",0x6a9428);
  DFsScript::NewFunction(this,"movefloor",0x6a89f6);
  DFsScript::NewFunction(this,"ceilheight",0x6a8b68);
  DFsScript::NewFunction(this,"ceilingheight",0x6a8b68);
  DFsScript::NewFunction(this,"moveceil",0x6a8e50);
  DFsScript::NewFunction(this,"moveceiling",0x6a8e50);
  DFsScript::NewFunction(this,"ceilingtexture",0x6a9662);
  DFsScript::NewFunction(this,"ceiltext",0x6a9662);
  DFsScript::NewFunction(this,"lightlevel",0x6a900c);
  DFsScript::NewFunction(this,"fadelight",0x6a92cc);
  DFsScript::NewFunction(this,"colormap",0x6a9660);
  DFsScript::NewFunction(this,"setcamera",0x6a8262);
  DFsScript::NewFunction(this,"clearcamera",0x6a843e);
  DFsScript::NewFunction(this,"movecamera",0x6aaf06);
  DFsScript::NewFunction(this,"pointtoangle",0x6a80b2);
  DFsScript::NewFunction(this,"pointtodist",0x6a8198);
  DFsScript::NewFunction(this,"startsound",0x6a84a6);
  DFsScript::NewFunction(this,"startsectorsound",0x6a85fa);
  DFsScript::NewFunction(this,"ambientsound",0x6ab18e);
  DFsScript::NewFunction(this,"startambiantsound",0x6ab18e);
  DFsScript::NewFunction(this,"changemusic",0x6a9ca0);
  DFsScript::NewFunction(this,"changehublevel",0x6a9890);
  DFsScript::NewFunction(this,"opendoor",0x6a98ac);
  DFsScript::NewFunction(this,"closedoor",0x6a99d4);
  DFsScript::NewFunction(this,"newhupic",0x6ac2f0);
  DFsScript::NewFunction(this,"createpic",0x6ac2f0);
  DFsScript::NewFunction(this,"deletehupic",0x6ac384);
  DFsScript::NewFunction(this,"modifyhupic",0x6ac3de);
  DFsScript::NewFunction(this,"modifypic",0x6ac3de);
  DFsScript::NewFunction(this,"sethupicdisplay",0x6ac4a8);
  DFsScript::NewFunction(this,"setpicvisible",0x6ac4a8);
  DFsScript::NewFunction(this,"playdemo",0x6abcca);
  DFsScript::NewFunction(this,"runcommand",0x6a9a7c);
  DFsScript::NewFunction(this,"checkcvar",0x6abccc);
  DFsScript::NewFunction(this,"setlinetexture",0x6a9e56);
  DFsScript::NewFunction(this,"linetrigger",0x6a9ac8);
  DFsScript::NewFunction(this,"lineflag",0x6abb2c);
  DFsScript::NewFunction(this,"max",0x6aa06a);
  DFsScript::NewFunction(this,"min",0x6aa0ce);
  DFsScript::NewFunction(this,"abs",0x6aa132);
  DFsScript::NewFunction(this,"sin",0x6abf12);
  DFsScript::NewFunction(this,"asin",0x6abf80);
  DFsScript::NewFunction(this,"cos",0x6abfd2);
  DFsScript::NewFunction(this,"acos",0x6ac040);
  DFsScript::NewFunction(this,"tan",0x6ac092);
  DFsScript::NewFunction(this,"atan",0x6ac0e4);
  DFsScript::NewFunction(this,"exp",0x6ac136);
  DFsScript::NewFunction(this,"log",0x6ac188);
  DFsScript::NewFunction(this,"sqrt",0x6ac1da);
  DFsScript::NewFunction(this,"floor",0x6ac22c);
  DFsScript::NewFunction(this,"pow",0x6ac272);
  DFsScript::NewFunction(this,"setlineblocking",0x6a9cd4);
  DFsScript::NewFunction(this,"setlinetrigger",0x6acde8);
  DFsScript::NewFunction(this,"setlinemnblock",0x6a9d9a);
  DFsScript::NewFunction(this,"scriptwaitpre",0x6ad1c8);
  DFsScript::NewFunction(this,"exitsecret",0x6ab1e8);
  DFsScript::NewFunction(this,"objawaken",0x6ab112);
  DFsScript::NewFunction(this,"mobjvalue",0x6ab1f0);
  DFsScript::NewFunction(this,"stringvalue",0x6ab232);
  DFsScript::NewFunction(this,"intvalue",0x6ab294);
  DFsScript::NewFunction(this,"fixedvalue",0x6ab2d6);
  DFsScript::NewFunction(this,"spawnshot2",0x6acb30);
  DFsScript::NewFunction(this,"setcolor",0x6ac92e);
  DFsScript::NewFunction(this,"objradius",0x6ac5a0);
  DFsScript::NewFunction(this,"objheight",0x6ac642);
  DFsScript::NewFunction(this,"thingcount",0x6ac6e4);
  DFsScript::NewFunction(this,"killinsector",0x6accec);
  DFsScript::NewFunction(this,"levelnum",0x6ac584);
  DFsScript::NewFunction(this,"giveinventory",0x6aabfa);
  DFsScript::NewFunction(this,"takeinventory",0x6aaca2);
  DFsScript::NewFunction(this,"checkinventory",0x6aad4a);
  DFsScript::NewFunction(this,"setweapon",0x6aadda);
  DFsScript::NewFunction(this,"setcorona",0x6ac526);
  return;
}

Assistant:

void init_functions(void)
{
	for(unsigned i=0;i<countof(ActorNames_init);i++)
	{
		ActorTypes[i]=PClass::FindActor(ActorNames_init[i]);
	}

	DFsScript * gscr = global_script;

	// add all the functions
	gscr->NewVariable("consoleplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("displayplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("zoom", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("fov", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("trigger", svt_pMobj)->value.pMobj = &trigger_obj;

	// Create constants for all existing line specials
	int max = P_GetMaxLineSpecial();
	for(int i=0; i<=max; i++)
	{
		const FLineSpecial *ls = P_GetLineSpecialInfo(i);

		if (ls != NULL && ls->max_args >= 0)	// specials with max args set to -1 can only be used in a map and are of no use hee.
		{
			gscr->NewVariable(ls->name, svt_linespec)->value.ls = ls;
		}
	}
	
	// important C-emulating stuff
	gscr->NewFunction("break", &FParser::SF_Break);
	gscr->NewFunction("continue", &FParser::SF_Continue);
	gscr->NewFunction("return", &FParser::SF_Return);
	gscr->NewFunction("goto", &FParser::SF_Goto);
	gscr->NewFunction("include", &FParser::SF_Include);
	
	// standard FraggleScript functions
	gscr->NewFunction("print", &FParser::SF_Print);
	gscr->NewFunction("rnd", &FParser::SF_Rnd);	// Legacy uses a normal rand() call for this which is extremely dangerous.
	gscr->NewFunction("prnd", &FParser::SF_Rnd);	// I am mapping rnd and prnd to the same named RNG which should eliminate any problem
	gscr->NewFunction("input", &FParser::SF_Input);
	gscr->NewFunction("beep", &FParser::SF_Beep);
	gscr->NewFunction("clock", &FParser::SF_Clock);
	gscr->NewFunction("wait", &FParser::SF_Wait);
	gscr->NewFunction("tagwait", &FParser::SF_TagWait);
	gscr->NewFunction("scriptwait", &FParser::SF_ScriptWait);
	gscr->NewFunction("startscript", &FParser::SF_StartScript);
	gscr->NewFunction("scriptrunning", &FParser::SF_ScriptRunning);
	
	// doom stuff
	gscr->NewFunction("startskill", &FParser::SF_StartSkill);
	gscr->NewFunction("exitlevel", &FParser::SF_ExitLevel);
	gscr->NewFunction("tip", &FParser::SF_Tip);
	gscr->NewFunction("timedtip", &FParser::SF_TimedTip);
	gscr->NewFunction("message", &FParser::SF_Message);
	gscr->NewFunction("gameskill", &FParser::SF_Gameskill);
	gscr->NewFunction("gamemode", &FParser::SF_Gamemode);
	
	// player stuff
	gscr->NewFunction("playermsg", &FParser::SF_PlayerMsg);
	gscr->NewFunction("playertip", &FParser::SF_PlayerTip);
	gscr->NewFunction("playeringame", &FParser::SF_PlayerInGame);
	gscr->NewFunction("playername", &FParser::SF_PlayerName);
	gscr->NewFunction("playeraddfrag", &FParser::SF_PlayerAddFrag);
	gscr->NewFunction("playerobj", &FParser::SF_PlayerObj);
	gscr->NewFunction("isplayerobj", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("isobjplayer", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("skincolor", &FParser::SF_SkinColor);
	gscr->NewFunction("playerkeys", &FParser::SF_PlayerKeys);
	gscr->NewFunction("playerammo", &FParser::SF_PlayerAmmo);
	gscr->NewFunction("maxplayerammo", &FParser::SF_MaxPlayerAmmo); 
	gscr->NewFunction("playerweapon", &FParser::SF_PlayerWeapon);
	gscr->NewFunction("playerselwep", &FParser::SF_PlayerSelectedWeapon);
	
	// mobj stuff
	gscr->NewFunction("spawn", &FParser::SF_Spawn);
	gscr->NewFunction("spawnexplosion", &FParser::SF_SpawnExplosion);
	gscr->NewFunction("radiusattack", &FParser::SF_RadiusAttack);
	gscr->NewFunction("kill", &FParser::SF_KillObj);
	gscr->NewFunction("removeobj", &FParser::SF_RemoveObj);
	gscr->NewFunction("objx", &FParser::SF_ObjX);
	gscr->NewFunction("objy", &FParser::SF_ObjY);
	gscr->NewFunction("objz", &FParser::SF_ObjZ);
	gscr->NewFunction("testlocation", &FParser::SF_TestLocation);
	gscr->NewFunction("teleport", &FParser::SF_Teleport);
	gscr->NewFunction("silentteleport", &FParser::SF_SilentTeleport);
	gscr->NewFunction("damageobj", &FParser::SF_DamageObj);
	gscr->NewFunction("healobj", &FParser::SF_HealObj);
	gscr->NewFunction("player", &FParser::SF_Player);
	gscr->NewFunction("objsector", &FParser::SF_ObjSector);
	gscr->NewFunction("objflag", &FParser::SF_ObjFlag);
	gscr->NewFunction("pushobj", &FParser::SF_PushThing);
	gscr->NewFunction("pushthing", &FParser::SF_PushThing);
	gscr->NewFunction("objangle", &FParser::SF_ObjAngle);
	gscr->NewFunction("objhealth", &FParser::SF_ObjHealth);
	gscr->NewFunction("objdead", &FParser::SF_ObjDead);
	gscr->NewFunction("reactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objreactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objtarget", &FParser::SF_MobjTarget);
	gscr->NewFunction("objmomx", &FParser::SF_MobjMomx);
	gscr->NewFunction("objmomy", &FParser::SF_MobjMomy);
	gscr->NewFunction("objmomz", &FParser::SF_MobjMomz);

	gscr->NewFunction("spawnmissile", &FParser::SF_SpawnMissile);
	gscr->NewFunction("mapthings", &FParser::SF_MapThings);
	gscr->NewFunction("objtype", &FParser::SF_ObjType);
	gscr->NewFunction("mapthingnumexist", &FParser::SF_MapThingNumExist);
	gscr->NewFunction("objstate", &FParser::SF_ObjState);
	gscr->NewFunction("resurrect", &FParser::SF_Resurrect);
	gscr->NewFunction("lineattack", &FParser::SF_LineAttack);
	gscr->NewFunction("setobjposition", &FParser::SF_SetObjPosition);

	// sector stuff
	gscr->NewFunction("floorheight", &FParser::SF_FloorHeight);
	gscr->NewFunction("floortext", &FParser::SF_FloorTexture);
	gscr->NewFunction("floortexture", &FParser::SF_FloorTexture);   // haleyjd: alias
	gscr->NewFunction("movefloor", &FParser::SF_MoveFloor);
	gscr->NewFunction("ceilheight", &FParser::SF_CeilingHeight);
	gscr->NewFunction("ceilingheight", &FParser::SF_CeilingHeight); // haleyjd: alias
	gscr->NewFunction("moveceil", &FParser::SF_MoveCeiling);
	gscr->NewFunction("moveceiling", &FParser::SF_MoveCeiling);     // haleyjd: aliases
	gscr->NewFunction("ceilingtexture", &FParser::SF_CeilingTexture);
	gscr->NewFunction("ceiltext", &FParser::SF_CeilingTexture);  // haleyjd: wrong
	gscr->NewFunction("lightlevel", &FParser::SF_LightLevel);    // handler - was
	gscr->NewFunction("fadelight", &FParser::SF_FadeLight);      // &FParser::SF_FloorTexture!
	gscr->NewFunction("colormap", &FParser::SF_SectorColormap);
	
	// cameras!
	gscr->NewFunction("setcamera", &FParser::SF_SetCamera);
	gscr->NewFunction("clearcamera", &FParser::SF_ClearCamera);
	gscr->NewFunction("movecamera", &FParser::SF_MoveCamera);
	
	// trig functions
	gscr->NewFunction("pointtoangle", &FParser::SF_PointToAngle);
	gscr->NewFunction("pointtodist", &FParser::SF_PointToDist);
	
	// sound functions
	gscr->NewFunction("startsound", &FParser::SF_StartSound);
	gscr->NewFunction("startsectorsound", &FParser::SF_StartSectorSound);
	gscr->NewFunction("ambientsound", &FParser::SF_AmbientSound);
	gscr->NewFunction("startambiantsound", &FParser::SF_AmbientSound);	// Legacy's incorrectly spelled name!
	gscr->NewFunction("changemusic", &FParser::SF_ChangeMusic);
	
	// hubs!
	gscr->NewFunction("changehublevel", &FParser::SF_ChangeHubLevel);
	
	// doors
	gscr->NewFunction("opendoor", &FParser::SF_OpenDoor);
	gscr->NewFunction("closedoor", &FParser::SF_CloseDoor);

	// HU Graphics
	gscr->NewFunction("newhupic", &FParser::SF_NewHUPic);
	gscr->NewFunction("createpic", &FParser::SF_NewHUPic);
	gscr->NewFunction("deletehupic", &FParser::SF_DeleteHUPic);
	gscr->NewFunction("modifyhupic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("modifypic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("sethupicdisplay", &FParser::SF_SetHUPicDisplay);
	gscr->NewFunction("setpicvisible", &FParser::SF_SetHUPicDisplay);

	//
	gscr->NewFunction("playdemo", &FParser::SF_PlayDemo);
	gscr->NewFunction("runcommand", &FParser::SF_RunCommand);
	gscr->NewFunction("checkcvar", &FParser::SF_CheckCVar);
	gscr->NewFunction("setlinetexture", &FParser::SF_SetLineTexture);
	gscr->NewFunction("linetrigger", &FParser::SF_LineTrigger);
	gscr->NewFunction("lineflag", &FParser::SF_LineFlag);

	//Hurdler: new math functions
	gscr->NewFunction("max", &FParser::SF_Max);
	gscr->NewFunction("min", &FParser::SF_Min);
	gscr->NewFunction("abs", &FParser::SF_Abs);

	gscr->NewFunction("sin", &FParser::SF_Sin);
	gscr->NewFunction("asin", &FParser::SF_ASin);
	gscr->NewFunction("cos", &FParser::SF_Cos);
	gscr->NewFunction("acos", &FParser::SF_ACos);
	gscr->NewFunction("tan", &FParser::SF_Tan);
	gscr->NewFunction("atan", &FParser::SF_ATan);
	gscr->NewFunction("exp", &FParser::SF_Exp);
	gscr->NewFunction("log", &FParser::SF_Log);
	gscr->NewFunction("sqrt", &FParser::SF_Sqrt);
	gscr->NewFunction("floor", &FParser::SF_Floor);
	gscr->NewFunction("pow", &FParser::SF_Pow);
	
	// Eternity extensions
	gscr->NewFunction("setlineblocking", &FParser::SF_SetLineBlocking);
	gscr->NewFunction("setlinetrigger", &FParser::SF_SetLineTrigger);
	gscr->NewFunction("setlinemnblock", &FParser::SF_SetLineMonsterBlocking);
	gscr->NewFunction("scriptwaitpre", &FParser::SF_ScriptWaitPre);
	gscr->NewFunction("exitsecret", &FParser::SF_ExitSecret);
	gscr->NewFunction("objawaken", &FParser::SF_ObjAwaken);
	
	// forced coercion functions
	gscr->NewFunction("mobjvalue", &FParser::SF_MobjValue);
	gscr->NewFunction("stringvalue", &FParser::SF_StringValue);
	gscr->NewFunction("intvalue", &FParser::SF_IntValue);
	gscr->NewFunction("fixedvalue", &FParser::SF_FixedValue);

	// new for GZDoom
	gscr->NewFunction("spawnshot2", &FParser::SF_SpawnShot2);
	gscr->NewFunction("setcolor", &FParser::SF_SetColor);
	gscr->NewFunction("objradius", &FParser::SF_MobjRadius);
	gscr->NewFunction("objheight", &FParser::SF_MobjHeight);
	gscr->NewFunction("thingcount", &FParser::SF_ThingCount);
	gscr->NewFunction("killinsector", &FParser::SF_KillInSector);
	gscr->NewFunction("levelnum", &FParser::SF_LevelNum);

	// new inventory
	gscr->NewFunction("giveinventory", &FParser::SF_GiveInventory);
	gscr->NewFunction("takeinventory", &FParser::SF_TakeInventory);
	gscr->NewFunction("checkinventory", &FParser::SF_CheckInventory);
	gscr->NewFunction("setweapon", &FParser::SF_SetWeapon);

	// Dummies - shut up warnings
	gscr->NewFunction("setcorona", &FParser::SF_SetCorona);
}